

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O2

void __thiscall
TEST_MockCallTest_expectOneCallInScopeButActualCallInGlobal_Test::testBody
          (TEST_MockCallTest_expectOneCallInScopeButActualCallInGlobal_Test *this)

{
  UtestShell *test;
  MockSupport *pMVar1;
  MockFailureReporterInstaller failureReporterInstaller;
  MockExpectedCallsListForTest emptyExpectations;
  MockUnexpectedCallHappenedFailure expectedFailure;
  MockFailureReporterInstaller local_a1;
  SimpleString local_a0;
  SimpleString local_90;
  MockExpectedCallsList local_80;
  TestFailure local_70;
  
  MockFailureReporterInstaller::MockFailureReporterInstaller(&local_a1);
  MockExpectedCallsListForTest::MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)&local_80);
  test = mockFailureTest();
  SimpleString::SimpleString(&local_a0,"foo");
  MockUnexpectedCallHappenedFailure::MockUnexpectedCallHappenedFailure
            ((MockUnexpectedCallHappenedFailure *)&local_70,test,&local_a0,&local_80);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::SimpleString(&local_a0,"scope");
  pMVar1 = mock(&local_a0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_90,"foo");
  (*pMVar1->_vptr_MockSupport[3])(pMVar1,&local_90);
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::SimpleString(&local_a0,"");
  pMVar1 = mock(&local_a0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_90,"foo");
  (*pMVar1->_vptr_MockSupport[6])(pMVar1,&local_90);
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString(&local_a0);
  CHECK_EXPECTED_MOCK_FAILURE_LOCATION
            ((MockFailure *)&local_70,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockCallTest.cpp"
             ,0xa5);
  SimpleString::SimpleString(&local_a0,"");
  pMVar1 = mock(&local_a0,(MockFailureReporter *)0x0);
  (*pMVar1->_vptr_MockSupport[0x27])(pMVar1);
  SimpleString::~SimpleString(&local_a0);
  TestFailure::~TestFailure(&local_70);
  MockExpectedCallsListForTest::~MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)&local_80);
  MockFailureReporterInstaller::~MockFailureReporterInstaller(&local_a1);
  return;
}

Assistant:

TEST(MockCallTest, expectOneCallInScopeButActualCallInGlobal)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest emptyExpectations;
    MockUnexpectedCallHappenedFailure expectedFailure(mockFailureTest(), "foo", emptyExpectations);

    mock("scope").expectOneCall("foo");
    mock().actualCall("foo");

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
    mock().clear();
}